

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog>
               (GetterXsYs<int> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this;
  long lVar8;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  float fVar11;
  double dVar12;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    iVar9 = *(int *)((long)getter->Xs + lVar8);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar12 = log10((double)*(int *)((long)getter->Ys + lVar8) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar6->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar10].Range.Min;
    local_3c.x = (float)(((double)iVar9 - (pIVar4->XAxis).Range.Min) * pIVar6->Mx +
                        (double)pIVar6->PixelRange[iVar10].Min.x);
    local_3c.y = (float)((((double)(float)(dVar12 / pIVar6->LogDenY[iVar10]) *
                           (pIVar4->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) *
                         pIVar6->My[iVar10] + (double)pIVar6->PixelRange[iVar10].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLog> *)local_58,
               local_60,&pIVar4->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    iVar9 = *(int *)((long)getter->Xs + lVar8);
    dVar12 = log10((double)*(int *)((long)getter->Ys + lVar8) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar6->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar10].Range.Min;
    local_58._0_4_ =
         (undefined4)
         (((double)iVar9 - (pIVar4->XAxis).Range.Min) * pIVar6->Mx +
         (double)pIVar6->PixelRange[iVar10].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar12 / pIVar6->LogDenY[iVar10]) *
                   (pIVar4->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) * pIVar6->My[iVar10]
                + (double)pIVar6->PixelRange[iVar10].Min.y);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      do {
        pIVar7 = GImPlot;
        lVar8 = (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
        iVar9 = *(int *)((long)getter->Xs + lVar8);
        dVar12 = log10((double)*(int *)((long)getter->Ys + lVar8) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_60;
        iVar3 = transformer->YAxis;
        pIVar4 = pIVar7->CurrentPlot;
        dVar2 = pIVar4->YAxis[iVar3].Range.Min;
        local_70.x = (float)(((double)iVar9 - (pIVar4->XAxis).Range.Min) * pIVar7->Mx +
                            (double)pIVar7->PixelRange[iVar3].Min.x);
        fVar11 = (float)((((double)(float)(dVar12 / pIVar7->LogDenY[iVar3]) *
                           (pIVar4->YAxis[iVar3].Range.Max - dVar2) + dVar2) - dVar2) *
                         pIVar7->My[iVar3] + (double)pIVar7->PixelRange[iVar3].Min.y);
        local_70.y = fVar11;
        pIVar4 = pIVar6->CurrentPlot;
        fVar5 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar5 = fVar11;
        }
        if ((fVar5 < (pIVar4->PlotRect).Max.y) &&
           (fVar5 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                           -(uint)(fVar11 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
          fVar5 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar5 = local_70.x;
          }
          if ((fVar5 < (pIVar4->PlotRect).Max.x) &&
             (fVar5 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar5 && fVar5 != (pIVar4->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            local_68.x = local_70.x;
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
            ImDrawList::AddLine(this,&local_68,&local_70,col,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}